

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O2

void rw::AnimInterpolatorInfo::unregisterInterp(AnimInterpolatorInfo *interpInfo)

{
  long *plVar1;
  int32 i;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 10) {
      return;
    }
    plVar1 = &interpInfoList + lVar2;
    lVar2 = lVar2 + 1;
  } while ((AnimInterpolatorInfo *)*plVar1 != interpInfo);
  (*DAT_00144da0)((AnimInterpolatorInfo *)*plVar1);
  *(undefined8 *)(&gl3::needToReadBackTextures + lVar2 * 2) = 0;
  return;
}

Assistant:

void
AnimInterpolatorInfo::unregisterInterp(AnimInterpolatorInfo *interpInfo)
{
	for(int32 i = 0; i < MAXINTERPINFO; i++)
		if(interpInfoList[i] == interpInfo){
			rwFree(interpInfoList[i]);
			interpInfoList[i] = nil;
			return;
		}
}